

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i,real a)

{
  undefined1 auVar1 [16];
  int64_t iVar2;
  int64_t iVar3;
  real *prVar4;
  reference pvVar5;
  long in_RDX;
  vector<float,_std::allocator<float>_> *in_RDI;
  uint in_XMM0_Da;
  int64_t j;
  int64_t in_stack_ffffffffffffffa8;
  real in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  Matrix *in_stack_ffffffffffffffb8;
  Matrix *pMVar6;
  Matrix *local_28;
  
  if (in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                  ,0x49,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
  }
  iVar2 = Matrix::size(in_stack_ffffffffffffffb8,
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (in_RDX < iVar2) {
    iVar2 = size((Vector *)0x184cac);
    iVar3 = Matrix::size(in_stack_ffffffffffffffb8,
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (iVar2 == iVar3) {
      local_28 = (Matrix *)0x0;
      while( true ) {
        pMVar6 = local_28;
        iVar2 = Matrix::size(local_28,CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
        ;
        if (iVar2 <= (long)pMVar6) break;
        in_stack_ffffffffffffffb4 = in_XMM0_Da;
        prVar4 = Matrix::at((Matrix *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8,0x184d3d);
        in_stack_ffffffffffffffb0 = *prVar4;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(size_type)local_28);
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffffb0),
                                 ZEXT416(in_stack_ffffffffffffffb4),ZEXT416((uint)*pvVar5));
        *pvVar5 = auVar1._0_4_;
        local_28 = (Matrix *)
                   ((long)&(local_28->data_).super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1);
      }
      return;
    }
    __assert_fail("size() == A.size(1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                  ,0x4b,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
  }
  __assert_fail("i < A.size(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                ,0x4a,"void fasttext::Vector::addRow(const Matrix &, int64_t, real)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i, real a) {
  assert(i >= 0);
  assert(i < A.size(0));
  assert(size() == A.size(1));
  for (int64_t j = 0; j < A.size(1); j++) {
    data_[j] += a * A.at(i, j);
  }
}